

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall soplex::SoPlexBase<double>::Settings::IntParam::IntParam(IntParam *this)

{
  long lVar1;
  
  lVar1 = 0x10;
  do {
    *(long *)((long)this->name + lVar1 + -0x10) = (long)&this->name[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)this->name + lVar1 + -8) = 0;
    *(undefined1 *)((long)&this->name[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x390);
  lVar1 = 0x390;
  do {
    *(long *)((long)this->name + lVar1 + -0x10) = (long)&this->name[0]._M_dataplus._M_p + lVar1;
    *(undefined8 *)((long)this->name + lVar1 + -8) = 0;
    *(undefined1 *)((long)&this->name[0]._M_dataplus._M_p + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x710);
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)this->description);
  this->lower[0] = -1;
  this->upper[0] = 1;
  this->defaultValue[0] = 1;
  std::__cxx11::string::assign((char *)(this->name + 1));
  std::__cxx11::string::assign((char *)(this->description + 1));
  this->lower[1] = 0;
  this->upper[1] = 2;
  this->defaultValue[1] = 0;
  std::__cxx11::string::assign((char *)(this->name + 2));
  std::__cxx11::string::assign((char *)(this->description + 2));
  this->lower[2] = 0;
  this->upper[2] = 1;
  this->defaultValue[2] = 1;
  std::__cxx11::string::assign((char *)(this->name + 3));
  std::__cxx11::string::assign((char *)(this->description + 3));
  this->lower[3] = 0;
  this->upper[3] = 1;
  this->defaultValue[3] = 1;
  std::__cxx11::string::assign((char *)(this->name + 4));
  std::__cxx11::string::assign((char *)(this->description + 4));
  this->lower[4] = 0;
  this->upper[4] = 0x7fffffff;
  this->defaultValue[4] = 0;
  std::__cxx11::string::assign((char *)(this->name + 5));
  std::__cxx11::string::assign((char *)(this->description + 5));
  this->lower[5] = -1;
  this->upper[5] = 0x7fffffff;
  this->defaultValue[5] = -1;
  std::__cxx11::string::assign((char *)(this->name + 6));
  std::__cxx11::string::assign((char *)(this->description + 6));
  this->lower[6] = -1;
  this->upper[6] = 0x7fffffff;
  this->defaultValue[6] = -1;
  std::__cxx11::string::assign((char *)(this->name + 7));
  std::__cxx11::string::assign((char *)(this->description + 7));
  this->lower[7] = -1;
  this->upper[7] = 0x7fffffff;
  this->defaultValue[7] = -1;
  std::__cxx11::string::assign((char *)(this->name + 8));
  std::__cxx11::string::assign((char *)(this->description + 8));
  this->lower[8] = 1;
  this->upper[8] = 0x7fffffff;
  this->defaultValue[8] = 200;
  std::__cxx11::string::assign((char *)(this->name + 9));
  std::__cxx11::string::assign((char *)(this->description + 9));
  this->lower[9] = 0;
  this->upper[9] = 5;
  this->defaultValue[9] = 3;
  std::__cxx11::string::assign((char *)(this->name + 10));
  std::__cxx11::string::assign((char *)(this->description + 10));
  this->lower[10] = 0;
  this->upper[10] = 3;
  this->defaultValue[10] = 3;
  std::__cxx11::string::assign((char *)(this->name + 0xb));
  std::__cxx11::string::assign((char *)(this->description + 0xb));
  this->lower[0xb] = 0;
  this->upper[0xb] = 6;
  this->defaultValue[0xb] = 2;
  std::__cxx11::string::assign((char *)(this->name + 0xc));
  std::__cxx11::string::assign((char *)(this->description + 0xc));
  this->lower[0xc] = 0;
  this->upper[0xc] = 3;
  this->defaultValue[0xc] = 0;
  std::__cxx11::string::assign((char *)(this->name + 0xd));
  std::__cxx11::string::assign((char *)(this->description + 0xd));
  this->lower[0xd] = 0;
  this->upper[0xd] = 5;
  this->defaultValue[0xd] = 0;
  std::__cxx11::string::assign((char *)(this->name + 0xe));
  std::__cxx11::string::assign((char *)(this->description + 0xe));
  this->lower[0xe] = 0;
  this->upper[0xe] = 3;
  this->defaultValue[0xe] = 3;
  std::__cxx11::string::assign((char *)(this->name + 0xf));
  std::__cxx11::string::assign((char *)(this->description + 0xf));
  this->lower[0xf] = 0;
  this->upper[0xf] = 2;
  this->defaultValue[0xf] = 0;
  std::__cxx11::string::assign((char *)(this->name + 0x10));
  std::__cxx11::string::assign((char *)(this->description + 0x10));
  this->lower[0x10] = 0;
  this->upper[0x10] = 1;
  this->defaultValue[0x10] = 0;
  std::__cxx11::string::assign((char *)(this->name + 0x11));
  std::__cxx11::string::assign((char *)(this->description + 0x11));
  this->lower[0x11] = 0;
  this->upper[0x11] = 2;
  this->defaultValue[0x11] = 1;
  std::__cxx11::string::assign((char *)(this->name + 0x12));
  std::__cxx11::string::assign((char *)(this->description + 0x12));
  this->lower[0x12] = 0;
  this->upper[0x12] = 2;
  this->defaultValue[0x12] = 1;
  std::__cxx11::string::assign((char *)(this->name + 0x13));
  std::__cxx11::string::assign((char *)(this->description + 0x13));
  this->lower[0x13] = 0;
  this->upper[0x13] = 2;
  this->defaultValue[0x13] = 1;
  std::__cxx11::string::assign((char *)(this->name + 0x14));
  std::__cxx11::string::assign((char *)(this->description + 0x14));
  this->lower[0x14] = 0;
  this->upper[0x14] = 2;
  this->defaultValue[0x14] = 1;
  std::__cxx11::string::assign((char *)(this->name + 0x15));
  std::__cxx11::string::assign((char *)(this->description + 0x15));
  this->lower[0x15] = 0;
  this->upper[0x15] = 0x7fffffff;
  this->defaultValue[0x15] = 2;
  std::__cxx11::string::assign((char *)(this->name + 0x16));
  std::__cxx11::string::assign((char *)(this->description + 0x16));
  this->lower[0x16] = 0;
  this->upper[0x16] = 0x7fffffff;
  this->defaultValue[0x16] = 0x32;
  std::__cxx11::string::assign((char *)(this->name + 0x17));
  std::__cxx11::string::assign((char *)(this->description + 0x17));
  this->lower[0x17] = 0;
  this->upper[0x17] = 2;
  this->defaultValue[0x17] = 0;
  std::__cxx11::string::assign((char *)(this->name + 0x18));
  std::__cxx11::string::assign((char *)(this->description + 0x18));
  this->lower[0x18] = -1;
  this->upper[0x18] = 3;
  this->defaultValue[0x18] = -1;
  std::__cxx11::string::assign((char *)(this->name + 0x19));
  std::__cxx11::string::assign((char *)(this->description + 0x19));
  this->lower[0x19] = 0;
  this->upper[0x19] = 2;
  this->defaultValue[0x19] = 1;
  std::__cxx11::string::assign((char *)(this->name + 0x1a));
  std::__cxx11::string::assign((char *)(this->description + 0x1a));
  this->lower[0x1a] = 0x32;
  this->upper[0x1a] = 0x7fffffff;
  this->defaultValue[0x1a] = 300;
  std::__cxx11::string::assign((char *)(this->name + 0x1b));
  std::__cxx11::string::assign((char *)(this->description + 0x1b));
  this->lower[0x1b] = 1;
  this->upper[0x1b] = 0x7fffffff;
  this->defaultValue[0x1b] = 10000;
  return;
}

Assistant:

SoPlexBase<R>::Settings::IntParam::IntParam()
{
   // objective sense
   name[SoPlexBase<R>::OBJSENSE] = "objsense";
   description[SoPlexBase<R>::OBJSENSE] = "objective sense (-1 - minimize, +1 - maximize)";
   lower[SoPlexBase<R>::OBJSENSE] = -1;
   upper[SoPlexBase<R>::OBJSENSE] = 1;
   defaultValue[SoPlexBase<R>::OBJSENSE] = SoPlexBase<R>::OBJSENSE_MAXIMIZE;

   // type of computational form, i.e., column or row representation
   name[SoPlexBase<R>::REPRESENTATION] = "representation";
   description[SoPlexBase<R>::REPRESENTATION] =
      "type of computational form (0 - auto, 1 - column representation, 2 - row representation)";
   lower[SoPlexBase<R>::REPRESENTATION] = 0;
   upper[SoPlexBase<R>::REPRESENTATION] = 2;
   defaultValue[SoPlexBase<R>::REPRESENTATION] = SoPlexBase<R>::REPRESENTATION_AUTO;

   // type of algorithm, i.e., primal or dual
   name[SoPlexBase<R>::ALGORITHM] = "algorithm";
   description[SoPlexBase<R>::ALGORITHM] = "type of algorithm (0 - primal, 1 - dual)";
   lower[SoPlexBase<R>::ALGORITHM] = 0;
   upper[SoPlexBase<R>::ALGORITHM] = 1;
   defaultValue[SoPlexBase<R>::ALGORITHM] = SoPlexBase<R>::ALGORITHM_DUAL;

   // type of LU update
   name[SoPlexBase<R>::FACTOR_UPDATE_TYPE] = "factor_update_type";
   description[SoPlexBase<R>::FACTOR_UPDATE_TYPE] =
      "type of LU update (0 - eta update, 1 - Forrest-Tomlin update)";
   lower[SoPlexBase<R>::FACTOR_UPDATE_TYPE] = 0;
   upper[SoPlexBase<R>::FACTOR_UPDATE_TYPE] = 1;
   defaultValue[SoPlexBase<R>::FACTOR_UPDATE_TYPE] = SoPlexBase<R>::FACTOR_UPDATE_TYPE_FT;

   // maximum number of updates without fresh factorization
   name[SoPlexBase<R>::FACTOR_UPDATE_MAX] = "factor_update_max";
   description[SoPlexBase<R>::FACTOR_UPDATE_MAX] =
      "maximum number of LU updates without fresh factorization (0 - auto)";
   lower[SoPlexBase<R>::FACTOR_UPDATE_MAX] = 0;
   upper[SoPlexBase<R>::FACTOR_UPDATE_MAX] = INT_MAX;
   defaultValue[SoPlexBase<R>::FACTOR_UPDATE_MAX] = 0;

   // iteration limit (-1 if unlimited)
   name[SoPlexBase<R>::ITERLIMIT] = "iterlimit";
   description[SoPlexBase<R>::ITERLIMIT] = "iteration limit (-1 - no limit)";
   lower[SoPlexBase<R>::ITERLIMIT] = -1;
   upper[SoPlexBase<R>::ITERLIMIT] = INT_MAX;
   defaultValue[SoPlexBase<R>::ITERLIMIT] = -1;

   // refinement limit (-1 if unlimited)
   name[SoPlexBase<R>::REFLIMIT] = "reflimit";
   description[SoPlexBase<R>::REFLIMIT] = "refinement limit (-1 - no limit)";
   lower[SoPlexBase<R>::REFLIMIT] = -1;
   upper[SoPlexBase<R>::REFLIMIT] = INT_MAX;
   defaultValue[SoPlexBase<R>::REFLIMIT] = -1;

   // stalling refinement limit (-1 if unlimited)
   name[SoPlexBase<R>::STALLREFLIMIT] = "stallreflimit";
   description[SoPlexBase<R>::STALLREFLIMIT] = "stalling refinement limit (-1 - no limit)";
   lower[SoPlexBase<R>::STALLREFLIMIT] = -1;
   upper[SoPlexBase<R>::STALLREFLIMIT] = INT_MAX;
   defaultValue[SoPlexBase<R>::STALLREFLIMIT] = -1;

   // display frequency
   name[SoPlexBase<R>::DISPLAYFREQ] = "displayfreq";
   description[SoPlexBase<R>::DISPLAYFREQ] = "display frequency";
   lower[SoPlexBase<R>::DISPLAYFREQ] = 1;
   upper[SoPlexBase<R>::DISPLAYFREQ] = INT_MAX;
   defaultValue[SoPlexBase<R>::DISPLAYFREQ] = 200;

   // verbosity level
   name[SoPlexBase<R>::VERBOSITY] = "verbosity";
   description[SoPlexBase<R>::VERBOSITY] =
      "verbosity level (0 - error, 1 - warning, 2 - debug, 3 - normal, 4 - high, 5 - full)";
   lower[SoPlexBase<R>::VERBOSITY] = 0;
   upper[SoPlexBase<R>::VERBOSITY] = 5;
   defaultValue[SoPlexBase<R>::VERBOSITY] = SoPlexBase<R>::VERBOSITY_NORMAL;
   //_intParamDefault[SoPlexBase<R>::VERBOSITY] = SoPlexBase<R>::VERBOSITY_FULL;

   // type of simplifier
   name[SoPlexBase<R>::SIMPLIFIER] = "simplifier";
   description[SoPlexBase<R>::SIMPLIFIER] = "simplifier (0 - off, 1 - auto, 2 - PaPILO, 3 - internal)";
   lower[SoPlexBase<R>::SIMPLIFIER] = 0;
   upper[SoPlexBase<R>::SIMPLIFIER] = 3;
   defaultValue[SoPlexBase<R>::SIMPLIFIER] = SoPlexBase<R>::SIMPLIFIER_INTERNAL;

   // type of scaler
   name[SoPlexBase<R>::SCALER] = "scaler";
   description[SoPlexBase<R>::SCALER] =
      "scaling (0 - off, 1 - uni-equilibrium, 2 - bi-equilibrium, 3 - geometric, 4 - iterated geometric, 5 - least squares, 6 - geometric-equilibrium)";
   lower[SoPlexBase<R>::SCALER] = 0;
   upper[SoPlexBase<R>::SCALER] = 6;
   defaultValue[SoPlexBase<R>::SCALER] = SoPlexBase<R>::SCALER_BIEQUI;

   // type of starter used to create crash basis
   name[SoPlexBase<R>::STARTER] = "starter";
   description[SoPlexBase<R>::STARTER] =
      "crash basis generated when starting from scratch (0 - none, 1 - weight, 2 - sum, 3 - vector)";
   lower[SoPlexBase<R>::STARTER] = 0;
   upper[SoPlexBase<R>::STARTER] = 3;
   defaultValue[SoPlexBase<R>::STARTER] = SoPlexBase<R>::STARTER_OFF;

   // type of pricer
   name[SoPlexBase<R>::PRICER] = "pricer";
   description[SoPlexBase<R>::PRICER] =
      "pricing method (0 - auto, 1 - dantzig, 2 - parmult, 3 - devex, 4 - quicksteep, 5 - steep)";
   lower[SoPlexBase<R>::PRICER] = 0;
   upper[SoPlexBase<R>::PRICER] = 5;
   defaultValue[SoPlexBase<R>::PRICER] = SoPlexBase<R>::PRICER_AUTO;

   // type of ratio test
   name[SoPlexBase<R>::RATIOTESTER] = "ratiotester";
   description[SoPlexBase<R>::RATIOTESTER] =
      "method for ratio test (0 - textbook, 1 - harris, 2 - fast, 3 - boundflipping)";
   lower[SoPlexBase<R>::RATIOTESTER] = 0;
   upper[SoPlexBase<R>::RATIOTESTER] = 3;
   defaultValue[SoPlexBase<R>::RATIOTESTER] = SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING;

   // mode for synchronizing real and rational LP
   name[SoPlexBase<R>::SYNCMODE] = "syncmode";
   description[SoPlexBase<R>::SYNCMODE] =
      "mode for synchronizing real and rational LP (0 - store only real LP, 1 - auto, 2 - manual)";
   lower[SoPlexBase<R>::SYNCMODE] = 0;
   upper[SoPlexBase<R>::SYNCMODE] = 2;
   defaultValue[SoPlexBase<R>::SYNCMODE] = SoPlexBase<R>::SYNCMODE_ONLYREAL;

   // mode for reading LP files
   name[SoPlexBase<R>::READMODE] = "readmode";
   description[SoPlexBase<R>::READMODE] =
      "mode for reading LP files (0 - floating-point, 1 - rational)";
   lower[SoPlexBase<R>::READMODE] = 0;
   upper[SoPlexBase<R>::READMODE] = 1;
   defaultValue[SoPlexBase<R>::READMODE] = SoPlexBase<R>::READMODE_REAL;

   // mode for iterative refinement strategy
   name[SoPlexBase<R>::SOLVEMODE] = "solvemode";
   description[SoPlexBase<R>::SOLVEMODE] =
      "mode for iterative refinement strategy (0 - floating-point solve, 1 - auto, 2 - exact rational solve)";
   lower[SoPlexBase<R>::SOLVEMODE] = 0;
   upper[SoPlexBase<R>::SOLVEMODE] = 2;
   defaultValue[SoPlexBase<R>::SOLVEMODE] = SoPlexBase<R>::SOLVEMODE_AUTO;

   // mode for iterative refinement strategy
   name[SoPlexBase<R>::CHECKMODE] = "checkmode";
   description[SoPlexBase<R>::CHECKMODE] =
      "mode for a posteriori feasibility checks (0 - floating-point check, 1 - auto, 2 - exact rational check)";
   lower[SoPlexBase<R>::CHECKMODE] = 0;
   upper[SoPlexBase<R>::CHECKMODE] = 2;
   defaultValue[SoPlexBase<R>::CHECKMODE] = SoPlexBase<R>::CHECKMODE_AUTO;

   // type of timing
   name[SoPlexBase<R>::TIMER] = "timer";
   description[SoPlexBase<R>::TIMER] =
      "type of timer (1 - cputime, aka. usertime, 2 - wallclock time, 0 - no timing)";
   lower[SoPlexBase<R>::TIMER] = 0;
   upper[SoPlexBase<R>::TIMER] = 2;
   defaultValue[SoPlexBase<R>::TIMER] = SoPlexBase<R>::TIMER_CPU;

   // mode for hyper sparse pricing
   name[SoPlexBase<R>::HYPER_PRICING] = "hyperpricing";
   description[SoPlexBase<R>::HYPER_PRICING] =
      "mode for hyper sparse pricing (0 - off, 1 - auto, 2 - always)";
   lower[SoPlexBase<R>::HYPER_PRICING] = 0;
   upper[SoPlexBase<R>::HYPER_PRICING] = 2;
   defaultValue[SoPlexBase<R>::HYPER_PRICING] = SoPlexBase<R>::HYPER_PRICING_AUTO;

   // minimum number of stalling refinements since last pivot to trigger rational factorization
   name[SoPlexBase<R>::RATFAC_MINSTALLS] = "ratfac_minstalls";
   description[SoPlexBase<R>::RATFAC_MINSTALLS] =
      "minimum number of stalling refinements since last pivot to trigger rational factorization";
   lower[SoPlexBase<R>::RATFAC_MINSTALLS] = 0;
   upper[SoPlexBase<R>::RATFAC_MINSTALLS] = INT_MAX;
   defaultValue[SoPlexBase<R>::RATFAC_MINSTALLS] = 2;

   // maximum number of conjugate gradient iterations in least square scaling
   name[SoPlexBase<R>::LEASTSQ_MAXROUNDS] = "leastsq_maxrounds";
   description[SoPlexBase<R>::LEASTSQ_MAXROUNDS] =
      "maximum number of conjugate gradient iterations in least square scaling";
   lower[SoPlexBase<R>::LEASTSQ_MAXROUNDS] = 0;
   upper[SoPlexBase<R>::LEASTSQ_MAXROUNDS] = INT_MAX;
   defaultValue[SoPlexBase<R>::LEASTSQ_MAXROUNDS] = 50;

   // mode for solution polishing
   name[SoPlexBase<R>::SOLUTION_POLISHING] = "solution_polishing";
   description[SoPlexBase<R>::SOLUTION_POLISHING] =
      "mode for solution polishing (0 - off, 1 - max basic slack, 2 - min basic slack)";
   lower[SoPlexBase<R>::SOLUTION_POLISHING] = 0;
   upper[SoPlexBase<R>::SOLUTION_POLISHING] = 2;
   defaultValue[SoPlexBase<R>::SOLUTION_POLISHING] = SoPlexBase<R>::POLISHING_OFF;

   // printing condition number during the solve
   name[SoPlexBase<R>::PRINTBASISMETRIC] = "printbasismetric";
   description[SoPlexBase<R>::PRINTBASISMETRIC] =
      "print basis metric during the solve (-1 - off, 0 - condition estimate , 1 - trace, 2 - determinant, 3 - condition)";
   lower[SoPlexBase<R>::PRINTBASISMETRIC] = -1;
   upper[SoPlexBase<R>::PRINTBASISMETRIC] = 3;
   defaultValue[SoPlexBase<R>::PRINTBASISMETRIC] = -1;

   /// measure time spent in solving steps, e.g. factorization time
   name[SoPlexBase<R>::STATTIMER] = "stattimer";
   description[SoPlexBase<R>::STATTIMER] =
      "measure for statistics, e.g. factorization time (0 - off, 1 - user time, 2 - wallclock time)";
   lower[SoPlexBase<R>::STATTIMER] = 0;
   upper[SoPlexBase<R>::STATTIMER] = 2;
   defaultValue[SoPlexBase<R>::STATTIMER] = 1;

   // maximum number of digits for the multiprecision type
   name[SoPlexBase<R>::MULTIPRECISION_LIMIT] = "multiprecision_limit";
   description[SoPlexBase<R>::MULTIPRECISION_LIMIT] =
      "maximum number of digits for the multiprecision type";
   lower[SoPlexBase<R>::MULTIPRECISION_LIMIT] = 50;
   upper[SoPlexBase<R>::MULTIPRECISION_LIMIT] = INT_MAX;
   defaultValue[SoPlexBase<R>::MULTIPRECISION_LIMIT] = 300;
   // if precision is too high, double tolerances are rounded to zero
   // 300 is very close to the greatest int k such that (double)1e-k != 0

   // at max, after how many simplex pivots do we store the advanced and stable basis, 1 = every iterations
   name[SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ] = "storeBasisSimplexFreq";
   description[SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ] =
      "at max, after how many simplex pivots do we store the advanced and stable basis, 1 = every iterations";
   lower[SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ] = 1;
   upper[SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ] = INT_MAX;
   defaultValue[SoPlexBase<R>::STORE_BASIS_SIMPLEX_FREQ] = 10000;
}